

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_CPY_z_i(DisasContext_conflict1 *s,arg_CPY_z_i *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t dofs;
  uint32_t aofs;
  TCGv_i64 c;
  TCGv_i64 t_imm;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_CPY_z_i *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((a->esz == 0) && (uVar2 = extract32(s->insn,0xd,1), uVar2 != 0)) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      uVar2 = vec_full_reg_size(s);
      c = tcg_const_i64_aarch64(tcg_ctx_00,(long)a->imm);
      dofs = vec_full_reg_offset(s,a->rd);
      aofs = pred_full_reg_offset(s,a->pg);
      tcg_gen_gvec_2i_ool_aarch64(tcg_ctx_00,dofs,aofs,c,uVar2,uVar2,0,trans_CPY_z_i::fns[a->esz]);
      tcg_temp_free_i64(tcg_ctx_00,c);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_CPY_z_i(DisasContext *s, arg_CPY_z_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_2i * const fns[4] = {
        gen_helper_sve_cpy_z_b, gen_helper_sve_cpy_z_h,
        gen_helper_sve_cpy_z_s, gen_helper_sve_cpy_z_d,
    };

    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, a->imm);
        tcg_gen_gvec_2i_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                            pred_full_reg_offset(s, a->pg),
                            t_imm, vsz, vsz, 0, fns[a->esz]);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}